

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuiteTest.h
# Opt level: O0

void __thiscall
oout::SuiteTest::
SuiteTest<ContainMatchTest,ContainTestTest,CountErrorTest,CountFailureTest,CountTestTest,CtorExceptionTextTest,DirtyTestTest,EndsWithMatchTest,EndsWithTestTest,FunctionTextTest,GtestReportTextTest,MatchTestTest,MethodExceptionTextTest,NamedTestTest,OoutReportTextTest,PrintableTextTest,RegexMatchTest,RegexTestTest,SafeTestTest,SkippedTestTest,StartsWithMatchTest,StartsWithTestTest,SuiteTestTest,XmlReportTextTest>
          (SuiteTest *this,shared_ptr<const_oout::Test> *test1,shared_ptr<ContainMatchTest> *tests,
          shared_ptr<ContainTestTest> *tests_1,shared_ptr<CountErrorTest> *tests_2,
          shared_ptr<CountFailureTest> *tests_3,shared_ptr<CountTestTest> *tests_4,
          shared_ptr<CtorExceptionTextTest> *tests_5,shared_ptr<DirtyTestTest> *tests_6,
          shared_ptr<EndsWithMatchTest> *tests_7,shared_ptr<EndsWithTestTest> *tests_8,
          shared_ptr<FunctionTextTest> *tests_9,shared_ptr<GtestReportTextTest> *tests_10,
          shared_ptr<MatchTestTest> *tests_11,shared_ptr<MethodExceptionTextTest> *tests_12,
          shared_ptr<NamedTestTest> *tests_13,shared_ptr<OoutReportTextTest> *tests_14,
          shared_ptr<PrintableTextTest> *tests_15,shared_ptr<RegexMatchTest> *tests_16,
          shared_ptr<RegexTestTest> *tests_17,shared_ptr<SafeTestTest> *tests_18,
          shared_ptr<SkippedTestTest> *tests_19,shared_ptr<StartsWithMatchTest> *tests_20,
          shared_ptr<StartsWithTestTest> *tests_21,shared_ptr<SuiteTestTest> *tests_22,
          shared_ptr<XmlReportTextTest> *tests_23)

{
  initializer_list<std::shared_ptr<const_oout::Test>_> __l;
  shared_ptr<const_oout::Test> *local_228;
  allocator<std::shared_ptr<const_oout::Test>_> local_1f1;
  shared_ptr<const_oout::Test> local_1f0;
  shared_ptr<oout::Test_const> local_1e0 [16];
  shared_ptr<oout::Test_const> local_1d0 [16];
  shared_ptr<oout::Test_const> local_1c0 [16];
  shared_ptr<oout::Test_const> local_1b0 [16];
  shared_ptr<oout::Test_const> local_1a0 [16];
  shared_ptr<oout::Test_const> local_190 [16];
  shared_ptr<oout::Test_const> local_180 [16];
  shared_ptr<oout::Test_const> local_170 [16];
  shared_ptr<oout::Test_const> local_160 [16];
  shared_ptr<oout::Test_const> local_150 [16];
  shared_ptr<oout::Test_const> local_140 [16];
  shared_ptr<oout::Test_const> local_130 [16];
  shared_ptr<oout::Test_const> local_120 [16];
  shared_ptr<oout::Test_const> local_110 [16];
  shared_ptr<oout::Test_const> local_100 [16];
  shared_ptr<oout::Test_const> local_f0 [16];
  shared_ptr<oout::Test_const> local_e0 [16];
  shared_ptr<oout::Test_const> local_d0 [16];
  shared_ptr<oout::Test_const> local_c0 [16];
  shared_ptr<oout::Test_const> local_b0 [16];
  shared_ptr<oout::Test_const> local_a0 [16];
  shared_ptr<oout::Test_const> local_90 [16];
  shared_ptr<oout::Test_const> local_80 [16];
  shared_ptr<oout::Test_const> local_70 [16];
  shared_ptr<const_oout::Test> local_60;
  list<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
  local_50;
  shared_ptr<CountFailureTest> *local_38;
  shared_ptr<CountFailureTest> *tests_local_3;
  shared_ptr<CountErrorTest> *tests_local_2;
  shared_ptr<ContainTestTest> *tests_local_1;
  shared_ptr<ContainMatchTest> *tests_local;
  shared_ptr<const_oout::Test> *test1_local;
  SuiteTest *this_local;
  
  local_38 = tests_3;
  tests_local_3 = (shared_ptr<CountFailureTest> *)tests_2;
  tests_local_2 = (shared_ptr<CountErrorTest> *)tests_1;
  tests_local_1 = (shared_ptr<ContainTestTest> *)tests;
  tests_local = (shared_ptr<ContainMatchTest> *)test1;
  test1_local = (shared_ptr<const_oout::Test> *)this;
  std::shared_ptr<const_oout::Test>::shared_ptr(&local_1f0,test1);
  std::shared_ptr<oout::Test_const>::shared_ptr<ContainMatchTest,void>
            (local_1e0,(shared_ptr<ContainMatchTest> *)tests_local_1);
  std::shared_ptr<oout::Test_const>::shared_ptr<ContainTestTest,void>
            (local_1d0,(shared_ptr<ContainTestTest> *)tests_local_2);
  std::shared_ptr<oout::Test_const>::shared_ptr<CountErrorTest,void>
            (local_1c0,(shared_ptr<CountErrorTest> *)tests_local_3);
  std::shared_ptr<oout::Test_const>::shared_ptr<CountFailureTest,void>(local_1b0,local_38);
  std::shared_ptr<oout::Test_const>::shared_ptr<CountTestTest,void>(local_1a0,tests_4);
  std::shared_ptr<oout::Test_const>::shared_ptr<CtorExceptionTextTest,void>(local_190,tests_5);
  std::shared_ptr<oout::Test_const>::shared_ptr<DirtyTestTest,void>(local_180,tests_6);
  std::shared_ptr<oout::Test_const>::shared_ptr<EndsWithMatchTest,void>(local_170,tests_7);
  std::shared_ptr<oout::Test_const>::shared_ptr<EndsWithTestTest,void>(local_160,tests_8);
  std::shared_ptr<oout::Test_const>::shared_ptr<FunctionTextTest,void>(local_150,tests_9);
  std::shared_ptr<oout::Test_const>::shared_ptr<GtestReportTextTest,void>(local_140,tests_10);
  std::shared_ptr<oout::Test_const>::shared_ptr<MatchTestTest,void>(local_130,tests_11);
  std::shared_ptr<oout::Test_const>::shared_ptr<MethodExceptionTextTest,void>(local_120,tests_12);
  std::shared_ptr<oout::Test_const>::shared_ptr<NamedTestTest,void>(local_110,tests_13);
  std::shared_ptr<oout::Test_const>::shared_ptr<OoutReportTextTest,void>(local_100,tests_14);
  std::shared_ptr<oout::Test_const>::shared_ptr<PrintableTextTest,void>(local_f0,tests_15);
  std::shared_ptr<oout::Test_const>::shared_ptr<RegexMatchTest,void>(local_e0,tests_16);
  std::shared_ptr<oout::Test_const>::shared_ptr<RegexTestTest,void>(local_d0,tests_17);
  std::shared_ptr<oout::Test_const>::shared_ptr<SafeTestTest,void>(local_c0,tests_18);
  std::shared_ptr<oout::Test_const>::shared_ptr<SkippedTestTest,void>(local_b0,tests_19);
  std::shared_ptr<oout::Test_const>::shared_ptr<StartsWithMatchTest,void>(local_a0,tests_20);
  std::shared_ptr<oout::Test_const>::shared_ptr<StartsWithTestTest,void>(local_90,tests_21);
  std::shared_ptr<oout::Test_const>::shared_ptr<SuiteTestTest,void>(local_80,tests_22);
  std::shared_ptr<oout::Test_const>::shared_ptr<XmlReportTextTest,void>(local_70,tests_23);
  local_60.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x19;
  local_60.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_1f0;
  std::allocator<std::shared_ptr<const_oout::Test>_>::allocator(&local_1f1);
  __l._M_len = (size_type)
               local_60.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi;
  __l._M_array = (iterator)
                 local_60.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::
  list<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>::list
            (&local_50,__l,&local_1f1);
  SuiteTest(this,&local_50);
  std::__cxx11::
  list<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>::
  ~list(&local_50);
  std::allocator<std::shared_ptr<const_oout::Test>_>::~allocator(&local_1f1);
  local_228 = &local_60;
  do {
    local_228 = local_228 + -1;
    std::shared_ptr<const_oout::Test>::~shared_ptr(local_228);
  } while (local_228 != &local_1f0);
  return;
}

Assistant:

explicit SuiteTest(
			const std::shared_ptr<const Test> &test1,
			const std::shared_ptr<T> & ... tests
		) : SuiteTest(std::list<std::shared_ptr<const Test>>{
			test1, tests...
		})
	{
	}